

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP3Deserializer::ParseVariablesIndex
          (BP3Deserializer *this,BufferSTL *bufferSTL,Engine *engine)

{
  element_type *peVar1;
  char *pcVar2;
  uint uVar3;
  unsigned_long uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  BP3Deserializer *pBVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  size_t sVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  _Result_base *p_Var13;
  pointer puVar14;
  void *pvVar15;
  future<void> *async;
  _Alloc_hider this_00;
  _State_baseV2 *__tmp;
  void *__stat_loc;
  long lVar16;
  vector<char,_std::allocator<char>_> *buffer;
  Engine *engine_00;
  size_t sVar17;
  pointer puVar18;
  bool bVar19;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> asyncs;
  type lf_ReadElementIndex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> asyncPositions;
  __state_type local_f8;
  void *local_e8;
  pointer local_e0;
  long *local_d8;
  Engine *local_d0;
  vector<char,_std::allocator<char>_> *local_c8;
  BP3Deserializer *local_c0;
  undefined **local_b8;
  size_t local_b0;
  ulong local_a8;
  string local_a0;
  BP3Deserializer *local_80;
  __basic_future<void> local_78;
  void *local_68;
  size_t local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  _func_int **local_40 [2];
  
  sVar11 = (this->m_Minifooter).PGIndexStart;
  sVar17 = (this->m_Minifooter).VarsIndexStart;
  local_d0 = engine;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_80 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0," BP3 variable index start < pg index start, in call to Open","");
  sVar11 = helper::GetDistance(sVar17,sVar11,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  engine_00 = local_d0;
  buffer = &bufferSTL->m_Buffer;
  sVar11 = sVar11 + 0xc;
  local_e8 = (void *)(((this->m_Minifooter).AttributesIndexStart -
                      (this->m_Minifooter).VarsIndexStart) - 0xc);
  if (*(int *)(&this->field_0x230 + *(long *)(*(long *)this + -0x18)) == 1) {
    if (local_e8 != (void *)0x0) {
      sVar17 = sVar11;
      do {
        std::
        tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>
        ::type::operator()(&local_80,engine_00,buffer,sVar17);
        sVar17 = sVar17 + *(uint *)((buffer->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data._M_start + sVar17) + 4;
      } while ((void *)(sVar17 - sVar11) < local_e8);
    }
  }
  else {
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&local_a0,
               (ulong)*(uint *)(&this->field_0x230 + *(long *)(*(long *)this + -0x18)),
               (allocator_type *)&local_58);
    __stat_loc = (void *)(ulong)*(uint *)(&this->field_0x230 + *(long *)(*(long *)this + -0x18));
    local_b0 = sVar11;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_58,(size_type)__stat_loc,(allocator_type *)&local_f8);
    this_00._M_p = local_a0._M_dataplus._M_p;
    if (local_e8 != (void *)0x0) {
      local_b8 = &PTR__M_destroy_008847f8;
      __stat_loc = (void *)0x0;
      local_a8 = 0;
      pvVar15 = local_e8;
      sVar11 = local_b0;
      local_c8 = buffer;
      local_c0 = this;
      do {
        puVar14 = *(pointer *)(*(long *)this + -0x18);
        if (*(int *)(&this->field_0x230 + (long)puVar14) != 0) {
          lVar16 = 0;
          puVar18 = (pointer)0x0;
          do {
            local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[(long)puVar18] = sVar11;
            uVar3 = *(uint *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start + sVar11);
            if ((local_a8 & 1) != 0) {
              local_e0 = puVar18;
              std::future<void>::get((future<void> *)(local_a0._M_dataplus._M_p + lVar16));
              pvVar15 = local_e8;
              puVar18 = local_e0;
            }
            sVar11 = sVar11 + uVar3 + 4;
            __stat_loc = (void *)(sVar11 - local_b0);
            if (__stat_loc <= pvVar15) {
              local_e0 = local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              local_f8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              local_f8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_68 = __stat_loc;
              local_60 = sVar11;
              p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
              p_Var12->_M_use_count = 1;
              p_Var12->_M_weak_count = 1;
              p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00884678
              ;
              peVar1 = (element_type *)(p_Var12 + 1);
              p_Var12[2]._M_use_count = 0;
              p_Var12[1]._M_use_count = 0;
              p_Var12[1]._M_weak_count = 0;
              *(undefined8 *)((long)&p_Var12[1]._M_weak_count + 1) = 0;
              p_Var12[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var12[3]._M_use_count = 0;
              p_Var12[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_008846c8;
              p_Var13 = (_Result_base *)operator_new(0x10);
              *(undefined8 *)p_Var13 = 0;
              *(undefined8 *)(p_Var13 + 8) = 0;
              std::__future_base::_Result_base::_Result_base(p_Var13);
              pBVar6 = local_80;
              *(undefined ***)p_Var13 = local_b8;
              p_Var12[4]._vptr__Sp_counted_base = (_func_int **)p_Var13;
              uVar4 = local_e0[(long)puVar18];
              p_Var12[4]._M_use_count = (int)uVar4;
              p_Var12[4]._M_weak_count = (int)(uVar4 >> 0x20);
              p_Var12[5]._vptr__Sp_counted_base = (_func_int **)local_c8;
              *(Engine **)&p_Var12[5]._M_use_count = engine_00;
              p_Var12[6]._vptr__Sp_counted_base = (_func_int **)local_80;
              local_40[0] = (_func_int **)0x0;
              local_d8 = (long *)operator_new(0x20);
              *local_d8 = (long)&PTR___State_00884720;
              local_d8[1] = (long)peVar1;
              local_d8[2] = (long)std::__future_base::
                                  _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>
                                  ::_M_run;
              local_d8[3] = 0;
              std::thread::_M_start_thread(local_40,&local_d8,0);
              if (local_d8 != (long *)0x0) {
                (**(code **)(*local_d8 + 8))();
              }
              _Var5._M_pi = local_f8.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
              if (p_Var12[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
                std::terminate();
              }
              p_Var12[3]._vptr__Sp_counted_base = local_40[0];
              bVar19 = local_f8.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_f8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = peVar1;
              local_f8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = p_Var12;
              if (bVar19) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
              }
              this = local_c0;
              if (local_f8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
                p_Var12->_M_use_count = 1;
                p_Var12->_M_weak_count = 1;
                p_Var12->_vptr__Sp_counted_base =
                     (_func_int **)&PTR___Sp_counted_ptr_inplace_00884760;
                p_Var12[2]._M_use_count = 0;
                p_Var12[1]._M_use_count = 0;
                p_Var12[1]._M_weak_count = 0;
                *(undefined8 *)((long)&p_Var12[1]._M_weak_count + 1) = 0;
                p_Var12[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_008847b0;
                p_Var13 = (_Result_base *)operator_new(0x10);
                *(undefined8 *)p_Var13 = 0;
                *(undefined8 *)(p_Var13 + 8) = 0;
                std::__future_base::_Result_base::_Result_base(p_Var13);
                this = local_c0;
                _Var5._M_pi = local_f8.
                              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                *(undefined ***)p_Var13 = local_b8;
                p_Var12[3]._vptr__Sp_counted_base = (_func_int **)p_Var13;
                uVar4 = local_e0[(long)puVar18];
                p_Var12[3]._M_use_count = (int)uVar4;
                p_Var12[3]._M_weak_count = (int)(uVar4 >> 0x20);
                p_Var12[4]._vptr__Sp_counted_base = (_func_int **)local_c8;
                *(Engine **)&p_Var12[4]._M_use_count = local_d0;
                p_Var12[5]._vptr__Sp_counted_base = (_func_int **)pBVar6;
                bVar19 = local_f8.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_f8.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)(p_Var12 + 1);
                local_f8.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = p_Var12;
                if (bVar19) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
                }
              }
              std::__basic_future<void>::__basic_future(&local_78,&local_f8);
              buffer = local_c8;
              engine_00 = local_d0;
              if (local_f8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_f8.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              uVar7 = local_78._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._0_4_;
              uVar8 = local_78._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_;
              uVar9 = local_78._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_4_;
              uVar10 = local_78._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._4_4_;
              local_78._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              local_78._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         (local_a0._M_dataplus._M_p + lVar16 + 8);
              pcVar2 = local_a0._M_dataplus._M_p + lVar16;
              *(undefined4 *)pcVar2 = uVar7;
              *(undefined4 *)(pcVar2 + 4) = uVar8;
              *(undefined4 *)(pcVar2 + 8) = uVar9;
              *(undefined4 *)(pcVar2 + 0xc) = uVar10;
              if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
              }
              pvVar15 = local_e8;
              sVar11 = local_60;
              __stat_loc = local_68;
              if (local_78._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_78._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
                pvVar15 = local_e8;
                sVar11 = local_60;
                __stat_loc = local_68;
              }
            }
            puVar18 = (pointer)((long)puVar18 + 1);
            puVar14 = (pointer)(ulong)*(uint *)(&this->field_0x230 +
                                               *(long *)(*(long *)this + -0x18));
            lVar16 = lVar16 + 0x10;
          } while (puVar18 < puVar14);
        }
        local_a8 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
        this_00._M_p = local_a0._M_dataplus._M_p;
      } while (__stat_loc < pvVar15);
    }
    for (; this_00._M_p != (pointer)local_a0._M_string_length;
        this_00._M_p = (pointer)((long)this_00._M_p + 0x10)) {
      if (*(size_type *)this_00._M_p != 0) {
        std::__basic_future<void>::wait((__basic_future<void> *)this_00._M_p,__stat_loc);
      }
    }
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&local_a0);
  }
  return;
}

Assistant:

void BP3Deserializer::ParseVariablesIndex(const BufferSTL &bufferSTL, core::Engine &engine)
{
    auto lf_ReadElementIndex = [&](core::Engine &engine, const std::vector<char> &buffer,
                                   size_t position) {
        const ElementIndexHeader header =
            ReadElementIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);

        switch (header.DataType)
        {

#define make_case(T)                                                                               \
    case (TypeTraits<T>::type_enum): {                                                             \
        DefineVariableInEngineIO<T>(header, engine, buffer, position);                             \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(make_case)
#undef make_case

        } // end switch
    };

    const auto &buffer = bufferSTL.m_Buffer;
    size_t position =
        helper::GetDistance(m_Minifooter.VarsIndexStart, m_Minifooter.PGIndexStart,
                            " BP3 variable index start < pg index start, in call to Open");

    helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian);
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    const size_t startPosition = position;
    size_t localPosition = 0;

    /* Note: In ADIOS 1.x BP3 files, length is unreliable and is
     * probably smaller than the actual length of the variable index. Let's use
     * here the more reliable limit: the start of attribute index - start of
     * variable index (- the already parsed 12 bytes)
     */
    const size_t varIndexLength =
        m_Minifooter.AttributesIndexStart - m_Minifooter.VarsIndexStart - 12;

    if (m_Parameters.Threads == 1)
    {
        while (localPosition < varIndexLength)
        {
            lf_ReadElementIndex(engine, buffer, position);

            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;
        }
        return;
    }

    // threads for reading Variables
    std::vector<std::future<void>> asyncs(m_Parameters.Threads);
    std::vector<size_t> asyncPositions(m_Parameters.Threads);

    bool launched = false;

    while (localPosition < varIndexLength)
    {
        // extract async positions
        for (unsigned int t = 0; t < m_Parameters.Threads; ++t)
        {
            asyncPositions[t] = position;
            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;

            if (launched)
            {
                asyncs[t].get();
            }

            if (localPosition <= varIndexLength)
            {
                asyncs[t] = std::async(std::launch::async, lf_ReadElementIndex, std::ref(engine),
                                       std::ref(buffer), asyncPositions[t]);
            }
        }
        launched = true;
    }

    for (auto &async : asyncs)
    {
        if (async.valid())
        {
            async.wait();
        }
    }
}